

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O2

int mpz_cmp(__mpz_struct *a,__mpz_struct *b)

{
  int iVar1;
  
  iVar1 = a->_mp_size;
  if (iVar1 != b->_mp_size) {
    return (uint)(b->_mp_size <= iVar1) * 2 + -1;
  }
  if (-1 < iVar1) {
    iVar1 = mpn_cmp(a->_mp_d,b->_mp_d,(long)iVar1);
    return iVar1;
  }
  iVar1 = mpn_cmp(b->_mp_d,a->_mp_d,-(long)iVar1);
  return iVar1;
}

Assistant:

int
mpz_cmp (const mpz_t a, const mpz_t b)
{
  mp_size_t asize = a->_mp_size;
  mp_size_t bsize = b->_mp_size;

  if (asize != bsize)
    return (asize < bsize) ? -1 : 1;
  else if (asize >= 0)
    return mpn_cmp (a->_mp_d, b->_mp_d, asize);
  else
    return mpn_cmp (b->_mp_d, a->_mp_d, -asize);
}